

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<4096,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  size_type sVar2;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar3;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  uint32_t *in_stack_fffffffffffffda8;
  undefined2 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb2;
  byte bVar4;
  undefined1 in_stack_fffffffffffffdb3;
  int in_stack_fffffffffffffdb4;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd0;
  undefined1 local_228 [163];
  uint8_t in_stack_fffffffffffffe7b;
  uint8_t in_stack_fffffffffffffe7c;
  uint8_t in_stack_fffffffffffffe7d;
  uint8_t in_stack_fffffffffffffe7e;
  uint8_t in_stack_fffffffffffffe7f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar3 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar3 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x1000,pcVar3,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12ee5f);
  Blob<4096>::Blob((Blob<4096> *)local_228);
  memset(local_228,0,0x200);
  if ((local_d & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_fffffffffffffdd0,
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    in_stack_fffffffffffffdb4 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,0);
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)CONCAT44(in_ESI,in_EDX),(void *)CONCAT44(in_ECX,in_R8D),
               in_stack_fffffffffffffdb4,
               CONCAT13(in_stack_fffffffffffffdb3,
                        CONCAT12(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0)),
               in_stack_fffffffffffffda8);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<4096>,unsigned_int>
            ((pfHash)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
             SUB41(in_ESI >> 0x18,0),(Blob<4096> *)CONCAT44(in_ECX,in_R8D),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,
                      CONCAT13(in_stack_fffffffffffffdb3,
                               CONCAT12(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0))));
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
  printf("%d keys\n",sVar2 & 0xffffffff);
  bVar4 = 1;
  bVar1 = TestHashList<unsigned_int>
                    (in_stack_fffffffffffffe80,(bool)in_stack_fffffffffffffe7f,
                     (bool)in_stack_fffffffffffffe7e,(bool)in_stack_fffffffffffffe7d,
                     (bool)in_stack_fffffffffffffe7c,(bool)in_stack_fffffffffffffe7b);
  bVar4 = bVar1 & bVar4;
  printf("\n");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}